

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O2

int process_tick(DUMB_IT_SIGRENDERER *sigrenderer)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  DUMB_IT_SIGDATA *pDVar5;
  IT_PLAYING *pIVar6;
  IT_PATTERN *pIVar7;
  _func_int_void_ptr *p_Var8;
  byte *pbVar9;
  long lVar10;
  uchar uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  IT_ENTRY *pIVar15;
  void *pvVar16;
  IT_ENTRY *pIVar17;
  ulong uVar18;
  ushort uVar19;
  int iVar20;
  long lVar21;
  char *pcVar22;
  int iVar23;
  uint uVar24;
  byte bVar25;
  ulong uVar26;
  IT_CHANNEL *pIVar27;
  uint uVar28;
  int i;
  long lVar29;
  bool bVar30;
  float fVar31;
  double dVar32;
  double dVar33;
  
  pDVar5 = sigrenderer->sigdata;
  iVar14 = sigrenderer->speed;
  if (iVar14 != 0) {
    piVar1 = &sigrenderer->tick;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      for (lVar29 = 0x35; lVar29 != 0x2835; lVar29 = lVar29 + 0xa0) {
        pcVar22 = sigrenderer->channel[0].arpeggio_offsets + lVar29 + -0x52;
        pcVar22[0] = '\0';
        pcVar22[1] = '\0';
        sigrenderer->channel[0].arpeggio_offsets[lVar29 + -0x50] = '\0';
      }
      sigrenderer->tick = iVar14;
      piVar1 = &sigrenderer->rowcount;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        sigrenderer->rowcount = 1;
        if (sigrenderer->n_rows == 0) {
          iVar14 = 0;
        }
        else {
          bit_array_set(sigrenderer->played,
                        (long)sigrenderer->row + (long)sigrenderer->order * 0x100);
          for (lVar29 = 0xb8; lVar29 != 0x28b8; lVar29 = lVar29 + 0xa0) {
            pvVar16 = *(void **)(sigrenderer->channel[0].arpeggio_offsets + lVar29 + -0x58);
            if (pvVar16 != (void *)0x0) {
              if (*(int *)(sigrenderer->channel[0].arpeggio_offsets + lVar29 + -0x50) ==
                  sigrenderer->order) {
                bit_array_set(pvVar16,(long)sigrenderer->row);
              }
              else {
                bit_array_destroy(pvVar16);
                *(undefined8 *)(sigrenderer->channel[0].arpeggio_offsets + lVar29 + -0x58) = 0;
                *(undefined4 *)(sigrenderer->channel[0].arpeggio_offsets + lVar29 + -0x50) = 0xfffe;
              }
            }
          }
          iVar14 = sigrenderer->n_rows;
        }
        uVar12 = sigrenderer->processrow + 1;
        sigrenderer->processrow = uVar12;
        if (iVar14 <= (int)uVar12) {
          iVar14 = sigrenderer->processorder;
          iVar23 = sigrenderer->breakrow;
          sigrenderer->breakrow = 0;
          sigrenderer->processrow = iVar23;
          if ((uVar12 & 0xfffff3ff) == 0xf3ff) {
            for (lVar29 = 0x94; lVar29 != 0x2894; lVar29 = lVar29 + 0xa0) {
              sigrenderer->channel[0].arpeggio_offsets[lVar29 + -0x50] = '\0';
            }
          }
          iVar23 = iVar14;
          if (iVar14 == 0xffff) {
            iVar23 = sigrenderer->order + -1;
          }
LAB_005815f8:
          do {
            iVar23 = iVar23 + 1;
            sigrenderer->processorder = iVar23;
            iVar20 = pDVar5->n_orders;
            if (iVar20 <= iVar23) {
              iVar23 = sigrenderer->restart_position;
              sigrenderer->processorder = iVar23;
              if (iVar20 <= iVar23) {
                sigrenderer->processorder = -1;
                iVar23 = -1;
                goto LAB_005815f8;
              }
              if ((pDVar5->flags & 0x800) != 0) {
                sigrenderer->speed = pDVar5->speed;
                sigrenderer->tempo = pDVar5->tempo;
                for (lVar29 = 0x20; lVar29 != 0x2820; lVar29 = lVar29 + 0xa0) {
                  xm_note_off(pDVar5,(IT_CHANNEL *)
                                     (sigrenderer->channel[0].arpeggio_offsets + lVar29 + -0x50));
                }
                iVar23 = sigrenderer->processorder;
              }
            }
            bVar25 = pDVar5->order[iVar23];
            if ((int)(uint)bVar25 < pDVar5->n_patterns) goto LAB_005816cd;
            if (bVar25 != 0xfe) {
              sigrenderer->processorder = sigrenderer->restart_position + -1;
            }
            for (iVar23 = 0; iVar23 != 0x100; iVar23 = iVar23 + 1) {
              bit_array_set(sigrenderer->played,(long)(sigrenderer->processorder * 0x100 + iVar23));
            }
            iVar23 = sigrenderer->processorder;
          } while( true );
        }
        pIVar15 = sigrenderer->entry;
        if (pIVar15 == (IT_ENTRY *)0x0) {
          bit_array_clear(sigrenderer->played,(long)sigrenderer->order << 8);
          sigrenderer->entry = sigrenderer->entry_start;
          sigrenderer->row = 0;
        }
        else {
          do {
            if (sigrenderer->entry_end <= pIVar15) break;
            bVar25 = pIVar15->channel;
            pIVar15 = pIVar15 + 1;
            sigrenderer->entry = pIVar15;
          } while (bVar25 < 0x40);
          sigrenderer->row = sigrenderer->row + 1;
        }
        goto LAB_0058180c;
      }
      for (pIVar15 = sigrenderer->entry;
          (pIVar15 < sigrenderer->entry_end && (pIVar15->channel < 0x40)); pIVar15 = pIVar15 + 1) {
        if (((pIVar15->mask & 8) != 0) && (pIVar15->effect != '\x0f')) {
          process_effects(sigrenderer,pIVar15,0);
        }
      }
      goto LAB_00581d12;
    }
  }
  if (((pDVar5->flags & 0x1000) != 0) && ((sigrenderer->tick & 0xf) != 0)) goto LAB_00581d1a;
  goto LAB_00581371;
LAB_005816cd:
  pIVar7 = pDVar5->pattern;
  iVar20 = sigrenderer->processrow;
  iVar4 = sigrenderer->n_rows;
  iVar3 = pIVar7[bVar25].n_rows;
  sigrenderer->n_rows = iVar3;
  if (iVar3 <= iVar20) {
    sigrenderer->processrow = 0;
    iVar20 = 0;
  }
  pIVar15 = pIVar7[bVar25].entry;
  sigrenderer->entry_start = pIVar15;
  sigrenderer->entry = pIVar15;
  sigrenderer->entry_end = pIVar15 + pIVar7[bVar25].n_entries;
  if (iVar4 == 0) {
LAB_005817c8:
    sigrenderer->order = sigrenderer->processorder;
    iVar14 = sigrenderer->processrow;
LAB_005817dc:
    bVar30 = iVar14 != 0;
    iVar14 = iVar14 + -1;
    if (bVar30) {
      pIVar15 = sigrenderer->entry;
      do {
        if (sigrenderer->entry_end <= pIVar15) break;
        bVar25 = pIVar15->channel;
        pIVar15 = pIVar15 + 1;
        sigrenderer->entry = pIVar15;
      } while (bVar25 < 0x40);
      goto LAB_005817dc;
    }
    sigrenderer->row = sigrenderer->processrow;
LAB_0058180c:
    if ((pDVar5->flags & 0x400) == 0) {
      reset_effects(sigrenderer);
    }
    uVar12 = 0;
    for (pIVar15 = sigrenderer->entry;
        (pIVar17 = sigrenderer->entry_end, pIVar15 < pIVar17 &&
        (uVar18 = (ulong)pIVar15->channel, uVar18 < 0x40)); pIVar15 = pIVar15 + 1) {
      uVar24 = 0;
      uVar28 = 0;
      if ((pIVar15->mask & 8) != 0) {
        if (pIVar15->effect == '\x13') {
          bVar25 = pIVar15->effectvalue;
          uVar13 = sigrenderer->sigdata->flags;
          if ((uVar13 >> 8 & 1) == 0) {
            if (bVar25 == 0) {
              bVar25 = sigrenderer->channel[uVar18].lastS;
            }
          }
          else {
            if (bVar25 == 0) {
              bVar25 = sigrenderer->channel[uVar18].lastDKL;
            }
            sigrenderer->channel[uVar18].lastDKL = bVar25;
          }
          sigrenderer->channel[uVar18].lastS = bVar25;
          uVar24 = uVar28;
          if (bVar25 >> 4 == 0xe) {
            sigrenderer->rowcount = (bVar25 & 0xf) + 1;
          }
          else if (bVar25 >> 4 == 0xb) {
            if ((bVar25 & 0xf) == 0) {
              pvVar16 = sigrenderer->channel[uVar18].played_patjump;
              if (pvVar16 == (void *)0x0) {
                pvVar16 = bit_array_create(0x100);
                sigrenderer->channel[uVar18].played_patjump = pvVar16;
              }
              else {
                iVar14 = sigrenderer->channel[uVar18].played_patjump_order;
                if (((long)iVar14 != 0xfffe) && (iVar14 != sigrenderer->order)) {
                  bit_array_merge(sigrenderer->played,pvVar16,(long)iVar14 << 8);
                  pvVar16 = sigrenderer->channel[uVar18].played_patjump;
                }
                bit_array_reset(pvVar16);
              }
              sigrenderer->channel[uVar18].played_patjump_order = sigrenderer->order;
              sigrenderer->channel[uVar18].pat_loop_row = (uchar)sigrenderer->processrow;
            }
            else {
              uVar11 = sigrenderer->channel[uVar18].pat_loop_count;
              if (uVar11 == '\0') {
                iVar14 = sigrenderer->channel[uVar18].played_patjump_order;
                if (iVar14 == 0xfffe) {
                  bit_array_destroy(sigrenderer->channel[uVar18].played_patjump);
                  pvVar16 = bit_array_create(0x100);
                  sigrenderer->channel[uVar18].played_patjump = pvVar16;
                  for (uVar26 = (ulong)sigrenderer->channel[uVar18].pat_loop_row;
                      (int)uVar26 <= sigrenderer->row; uVar26 = uVar26 + 1) {
                    bit_array_clear(sigrenderer->played,(long)sigrenderer->order * 0x100 + uVar26);
                  }
                  sigrenderer->channel[uVar18].played_patjump_order = sigrenderer->order;
                }
                else if (iVar14 == sigrenderer->order) {
                  bit_array_set(sigrenderer->channel[uVar18].played_patjump,(long)sigrenderer->row);
                  bit_array_mask(sigrenderer->played,sigrenderer->channel[uVar18].played_patjump,
                                 (long)sigrenderer->channel[uVar18].played_patjump_order << 8);
                }
                sigrenderer->channel[uVar18].pat_loop_count = bVar25 & 0xf;
                sigrenderer->breakrow = (uint)sigrenderer->channel[uVar18].pat_loop_row;
                uVar13 = sigrenderer->sigdata->flags;
              }
              else {
                uVar11 = uVar11 + 0xff;
                sigrenderer->channel[uVar18].pat_loop_count = uVar11;
                if (uVar11 == '\0') {
                  if ((uVar13 & 0xc0) == 0x40) {
                    sigrenderer->channel[uVar18].pat_loop_end_row = '\0';
                    if ((int)(sigrenderer->processrow | 0xc00U) < 0xfffe) {
                      sigrenderer->breakrow = (uint)sigrenderer->channel[uVar18].pat_loop_row;
                    }
                  }
                  else {
                    sigrenderer->channel[uVar18].pat_loop_row =
                         (char)sigrenderer->processrow + '\x01';
                  }
                  iVar14 = sigrenderer->order;
                  if (sigrenderer->channel[uVar18].played_patjump_order == iVar14) {
                    bit_array_destroy(sigrenderer->channel[uVar18].played_patjump);
                    sigrenderer->channel[uVar18].played_patjump = (void *)0x0;
                    sigrenderer->channel[uVar18].played_patjump_order = 0xfffe;
                    iVar14 = sigrenderer->order;
                  }
                  bit_array_clear(sigrenderer->played,(long)sigrenderer->row + (long)iVar14 * 0x100)
                  ;
                  goto LAB_00581c21;
                }
                if (sigrenderer->channel[uVar18].played_patjump_order == sigrenderer->order) {
                  bit_array_set(sigrenderer->channel[uVar18].played_patjump,(long)sigrenderer->row);
                  bit_array_mask(sigrenderer->played,sigrenderer->channel[uVar18].played_patjump,
                                 (long)sigrenderer->channel[uVar18].played_patjump_order << 8);
                  uVar13 = sigrenderer->sigdata->flags;
                }
                sigrenderer->breakrow = (uint)sigrenderer->channel[uVar18].pat_loop_row;
              }
              if ((uVar13 & 0xc0) == 0x40) {
                uVar28 = sigrenderer->processrow;
                uVar24 = 1;
                if ((int)(uVar28 | 0xc00) < 0xfffe) {
                  sigrenderer->processorder =
                       (int)uVar28 < (int)(uint)sigrenderer->channel[uVar18].pat_loop_end_row ^
                       0xffff;
                  sigrenderer->channel[uVar18].pat_loop_end_row = (uchar)uVar28;
                  sigrenderer->processrow = 0xffff;
                  uVar24 = 1;
                }
              }
              else {
                sigrenderer->processorder = 0xffff;
                sigrenderer->processrow = 0xfffe;
                uVar24 = 1;
              }
            }
          }
        }
        else if (pIVar15->effect == '\x02') {
          iVar14 = 0xf3fe;
          if ((sigrenderer->processrow & 0xfffffbffU) != 0xf3fe) {
            sigrenderer->breakrow = 0;
            iVar14 = 0xfbfe;
          }
          sigrenderer->processrow = iVar14;
          sigrenderer->processorder = pIVar15->effectvalue - 1;
        }
      }
LAB_00581c21:
      uVar12 = uVar12 | uVar24;
    }
    for (pIVar15 = sigrenderer->entry; pIVar15 < pIVar17; pIVar15 = pIVar15 + 1) {
      uVar24 = pDVar5->flags;
      if (0x3f < (ulong)pIVar15->channel) goto LAB_00581cfe;
      uVar28 = 0;
      if ((uVar24 & 0x40) == 0) {
        uVar28 = uVar12;
      }
      pIVar27 = sigrenderer->channel + pIVar15->channel;
      bVar25 = pIVar15->mask;
      if ((bVar25 & 1) != 0) {
        pIVar27->note = pIVar15->note;
      }
      if (((bVar25 & 9) != 0) && ((sigrenderer->sigdata->flags & 0x400) != 0)) {
        reset_channel_effects(pIVar27);
        if (pIVar27->playing != (IT_PLAYING *)0x0) {
          pIVar27->playing->finetune = 0;
        }
      }
      if ((((pIVar15->mask & 8) == 0) || (pIVar15->effect != '\x13')) ||
         ((pIVar27->lastS & 0xf0) != 0xd0)) {
        iVar14 = process_note_data(sigrenderer,pIVar15,uVar28);
        if (iVar14 != 0) {
          return 1;
        }
      }
      else {
        bVar25 = pIVar27->lastS & 0xf;
        if (bVar25 < 2) {
          bVar25 = 1;
        }
        pIVar27->note_delay_count = bVar25;
        pIVar27->note_delay_entry = pIVar15;
      }
      pIVar17 = sigrenderer->entry_end;
    }
    uVar24 = pDVar5->flags;
LAB_00581cfe:
    if ((uVar24 >> 0xb & 1) == 0) {
      if ((uVar24 & 0x10) == 0) {
        update_smooth_effects(sigrenderer);
      }
      goto LAB_00581d1a;
    }
LAB_00581d12:
    update_effects(sigrenderer);
    goto LAB_00581d1a;
  }
  if (iVar14 == 0xffff) {
    if (iVar23 < sigrenderer->order) goto LAB_00581776;
    goto LAB_005817c8;
  }
  if (sigrenderer->order < iVar23) goto LAB_005817c8;
LAB_00581776:
  iVar14 = bit_array_test(sigrenderer->played,(long)(iVar20 + iVar23 * 0x100));
  if (iVar14 == 0) goto LAB_005817c8;
  p_Var8 = sigrenderer->callbacks->loop;
  if (p_Var8 == (_func_int_void_ptr *)0x0) goto LAB_005817c8;
  iVar14 = (*p_Var8)(sigrenderer->callbacks->loop_data);
  if (iVar14 != 0) {
    return 1;
  }
  bit_array_reset(sigrenderer->played);
  if (sigrenderer->speed != 0) goto LAB_005817c8;
LAB_00581371:
  update_effects(sigrenderer);
  for (lVar29 = 0; lVar29 != 0x40; lVar29 = lVar29 + 1) {
    pIVar27 = sigrenderer->channel + lVar29;
    uVar11 = sigrenderer->channel[lVar29].key_off_count;
    if (uVar11 == '\0') {
      if (pIVar27->note_cut_count == '\0') {
        if ((pIVar27->note_delay_count != '\0') &&
           (uVar11 = pIVar27->note_delay_count + 0xff, pIVar27->note_delay_count = uVar11,
           uVar11 == '\0')) {
          process_note_data(sigrenderer,pIVar27->note_delay_entry,0);
        }
      }
      else {
        uVar11 = pIVar27->note_cut_count + 0xff;
        pIVar27->note_cut_count = uVar11;
        if (uVar11 == '\0') {
          if ((sigrenderer->sigdata->flags & 0x240) == 0) {
            pIVar6 = pIVar27->playing;
            if (pIVar6 != (IT_PLAYING *)0x0) {
              lVar10 = 0;
              do {
                lVar21 = lVar10;
                if (lVar21 == 0xc0) {
                  pIVar6->next = sigrenderer->free_playing;
                  sigrenderer->free_playing = pIVar6;
                  goto LAB_00581445;
                }
                lVar10 = lVar21 + 1;
              } while (sigrenderer->playing[lVar21] != (IT_PLAYING *)0x0);
              pIVar6->declick_stage = '\x03';
              sigrenderer->playing[lVar21] = pIVar6;
LAB_00581445:
              pIVar27->playing = (IT_PLAYING *)0x0;
            }
          }
          else {
            pIVar27->volume = '\0';
          }
        }
      }
    }
    else {
      uVar11 = uVar11 + 0xff;
      pIVar27->key_off_count = uVar11;
      if (uVar11 == '\0') {
        xm_note_off(sigrenderer->sigdata,pIVar27);
      }
    }
  }
LAB_00581d1a:
  p_Var8 = sigrenderer->callbacks->global_volume_zero;
  if (sigrenderer->globalvolume == '\0') {
    if (p_Var8 != (_func_int_void_ptr *)0x0) {
      iVar14 = ((int)(0x2800000 / (long)(sigrenderer->tempo << 8)) * 0x10000 +
                sigrenderer->gvz_sub_time >> 0x10) + sigrenderer->gvz_time;
      sigrenderer->gvz_time = iVar14;
      sigrenderer->gvz_sub_time = sigrenderer->gvz_sub_time & 0xffff;
      if ((0xbffff < iVar14) &&
         (iVar14 = (*p_Var8)(sigrenderer->callbacks->global_volume_zero_data), iVar14 != 0)) {
        return 1;
      }
    }
  }
  else if (p_Var8 != (_func_int_void_ptr *)0x0) {
    sigrenderer->gvz_time = 0;
    sigrenderer->gvz_sub_time = 0;
  }
  pDVar5 = sigrenderer->sigdata;
  iVar14 = sigrenderer->tempo;
  lVar29 = 0;
  do {
    if (lVar29 == 0x2800) {
      fVar31 = (float)iVar14 * 6.1035157e-06;
      for (lVar29 = 0xa8; lVar29 != 0x28a8; lVar29 = lVar29 + 0xa0) {
        pIVar6 = *(IT_PLAYING **)(sigrenderer->channel[0].arpeggio_offsets + lVar29 + -0x50);
        if (((pIVar6 != (IT_PLAYING *)0x0) &&
            (process_playing(sigrenderer,pIVar6,fVar31), (pDVar5->flags & 0x40) == 0)) &&
           (pIVar6 = *(IT_PLAYING **)(sigrenderer->channel[0].arpeggio_offsets + lVar29 + -0x50),
           (pIVar6->flags & 8) != 0)) {
          pIVar6->next = sigrenderer->free_playing;
          sigrenderer->free_playing = pIVar6;
          *(undefined8 *)(sigrenderer->channel[0].arpeggio_offsets + lVar29 + -0x50) = 0;
        }
      }
      for (lVar29 = 0x504; lVar29 != 0x5c4; lVar29 = lVar29 + 1) {
        pIVar6 = *(IT_PLAYING **)(sigrenderer->channel[0].arpeggio_offsets + lVar29 * 8 + -0x50);
        if (pIVar6 != (IT_PLAYING *)0x0) {
          process_playing(sigrenderer,pIVar6,fVar31);
          pIVar6 = *(IT_PLAYING **)(sigrenderer->channel[0].arpeggio_offsets + lVar29 * 8 + -0x50);
          if ((pIVar6->flags & 8) != 0) {
            pIVar6->next = sigrenderer->free_playing;
            sigrenderer->free_playing = pIVar6;
            *(undefined8 *)(sigrenderer->channel[0].arpeggio_offsets + lVar29 * 8 + -0x50) = 0;
          }
        }
      }
      lVar29 = (long)sigrenderer->sub_time_left +
               ((long)((int)(0x2800000 / (long)(sigrenderer->tempo << 8)) << 0x10) >>
               ((byte)((uint)sigrenderer->sigdata->flags >> 10) & 4));
      sigrenderer->time_left = sigrenderer->time_left + (int)((ulong)lVar29 >> 0x10);
      sigrenderer->sub_time_left = (uint)lVar29 & 0xffff;
      return 0;
    }
    pbVar9 = *(byte **)(sigrenderer->channel[0].arpeggio_offsets + lVar29 + 0x58);
    if (pbVar9 == (byte *)0x0) goto LAB_005820d4;
    switch(pbVar9[0x55]) {
    case 1:
      uVar18 = (ulong)pbVar9[0x54];
      pcVar22 = 
      "@??>>==<<;;::99887766554433221100//..--,,++**))((\'\'&&%%$$##\"\"!!  \x1f\x1f\x1e\x1e\x1d\x1d\x1c\x1c\x1b\x1b\x1a\x1a\x19\x19\x18\x18\x17\x17\x16\x16\x15\x15\x14\x14\x13\x13\x12\x12\x11\x11\x10\x10\x0f\x0f\x0e\x0e\r\r\f\f\v\v\n\n\t\t\b\b\a\a\x06\x06\x05\x05\x04\x04\x03\x03\x02\x02\x01\x01"
      ;
      break;
    case 2:
      uVar18 = (ulong)pbVar9[0x54];
      pcVar22 = 
      "@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@"
      ;
      break;
    case 3:
      iVar23 = rand();
      iVar23 = iVar23 % 0x81 + -0x40;
      goto LAB_00581e3b;
    case 4:
      uVar18 = (ulong)pbVar9[0x54];
      pcVar22 = it_xm_squarewave;
      break;
    case 5:
      uVar18 = (ulong)pbVar9[0x54];
      goto LAB_00581e22;
    case 6:
      uVar18 = (ulong)pbVar9[0x54] ^ 0xff;
LAB_00581e22:
      pcVar22 = "";
      break;
    default:
      uVar18 = (ulong)pbVar9[0x54];
      pcVar22 = "";
    }
    iVar23 = (int)pcVar22[uVar18];
LAB_00581e3b:
    iVar20 = (int)((uint)pbVar9[0x52] * (uint)pbVar9[0x53] * iVar23) >> 4;
    uVar12 = pDVar5->flags;
    iVar23 = -iVar20;
    if ((uVar12 & 0x10) == 0) {
      iVar23 = iVar20;
    }
    bVar25 = sigrenderer->channel[0].arpeggio_offsets[lVar29 + -0x2c];
    pbVar9[0x45] = bVar25;
    uVar19 = *(ushort *)(sigrenderer->channel[0].arpeggio_offsets + lVar29 + -0x26);
    *(ushort *)(pbVar9 + 0x46) = uVar19;
    bVar2 = pbVar9[0x48];
    if ((bVar2 != 0) &&
       (bVar25 = (char)((uint)bVar25 * (int)(char)bVar2 >> 7) + bVar25, pbVar9[0x45] = bVar25,
       0x40 < bVar25)) {
      pbVar9[0x45] = (byte)~bVar2 >> 1 & 0x40;
    }
    bVar25 = pbVar9[0x49];
    if (((bVar25 != 0) && (uVar19 < 0x4001)) &&
       (uVar19 = uVar19 + (ushort)bVar25 * 0x100, *(ushort *)(pbVar9 + 0x46) = uVar19,
       0x4000 < uVar19)) {
      *(ushort *)(pbVar9 + 0x46) = (ushort)(-1 < (char)bVar25) << 0xe;
    }
    if ((uVar12 & 8) == 0) {
      iVar4 = *(int *)(pbVar9 + 0x68);
      dVar32 = exp2((double)(int)(0x3c00 - ((uint)pbVar9[0x4a] * 0x100 + *(int *)(pbVar9 + 0x70))) *
                    0.0003255208333333158);
      iVar20 = *(int *)(*(long *)(pbVar9 + 0x10) + 0x44);
      fVar31 = (float)(iVar23 + iVar4) * -1.7621046e-08 + (float)dVar32 / (float)iVar20;
      if (4.656613e-10 <= fVar31) {
        fVar31 = 1.5258789e-05 / fVar31;
        goto LAB_00581f99;
      }
      *pbVar9 = *pbVar9 | 8;
      pbVar9[0x6c] = 0;
      pbVar9[0x6d] = 0;
      pbVar9[0x6e] = 0;
      pbVar9[0x6f] = 0x38;
    }
    else {
      iVar23 = (uint)pbVar9[0x4a] * 0x100 +
               iVar23 + *(int *)(pbVar9 + 0x70) + *(int *)(pbVar9 + 0x68) + -0x3c00;
      dVar32 = -10.666666666666092;
      if (-0x8001 < iVar23) {
        if (0x7ffe < iVar23) {
          iVar23 = 0x7fff;
        }
        dVar32 = (double)iVar23 * 0.0003255208333333158;
      }
      dVar32 = exp2(dVar32);
      iVar20 = *(int *)(*(long *)(pbVar9 + 0x10) + 0x44);
      fVar31 = (float)dVar32 * 1.5258789e-05 * (float)iVar20;
LAB_00581f99:
      *(float *)(pbVar9 + 0x6c) = fVar31;
      lVar10 = *(long *)(pbVar9 + 8);
      if (((*(char *)(lVar10 + 0x5b) != '\0') && (*(int *)(lVar10 + 0x4c) != 0)) &&
         (*(byte *)(lVar10 + 0x59) < 0x78)) {
        dVar32 = log((double)((fVar31 * 65536.0) / (float)iVar20));
        dVar33 = dVar32 * 17.31234049066756 + 60.5;
        dVar32 = 119.0;
        if ((dVar33 <= 119.0) && (dVar32 = dVar33, dVar33 < 0.0)) {
          dVar32 = 0.0;
        }
        dVar32 = exp2((double)((int)dVar32 + -0x3c) * 0.0833333333333334);
        fVar31 = (float)iVar20 * 1.5258789e-05 * (float)dVar32;
        *(float *)(pbVar9 + 0x6c) = fVar31;
      }
      uVar12 = sigrenderer->tick;
      uVar24 = sigrenderer->speed - uVar12;
      if (uVar24 == 0) {
        uVar12 = 0;
      }
      if ((sigrenderer->sigdata->flags & 0xc0U) != 0x40) {
        uVar12 = uVar24;
      }
      dVar32 = exp2((double)(int)sigrenderer->channel[0].arpeggio_offsets
                                 [(ulong)*(byte *)(*(long *)(sigrenderer->channel[0].
                                                             arpeggio_offsets + lVar29 + -8) +
                                                  (ulong)(uVar12 & 0x1f)) + lVar29] *
                    0.0833333333333334);
      *(float *)(pbVar9 + 0x6c) = (float)dVar32 * fVar31;
      pbVar9[0x4c] = sigrenderer->channel[0].arpeggio_offsets[lVar29 + -0x1f];
      pbVar9[0x4d] = sigrenderer->channel[0].arpeggio_offsets[lVar29 + -0x1e];
    }
LAB_005820d4:
    lVar29 = lVar29 + 0xa0;
  } while( true );
}

Assistant:

static int process_tick(DUMB_IT_SIGRENDERER *sigrenderer)
{
	DUMB_IT_SIGDATA *sigdata = sigrenderer->sigdata;

	// Set note vol/freq to vol/freq set for each channel

	if (sigrenderer->speed && --sigrenderer->tick == 0) {
		reset_tick_counts(sigrenderer);
		sigrenderer->tick = sigrenderer->speed;
		sigrenderer->rowcount--;
		if (sigrenderer->rowcount == 0) {
			sigrenderer->rowcount = 1;

#ifdef BIT_ARRAY_BULLSHIT
			if (sigrenderer->n_rows)
			{
#if 1
				/*
				if (bit_array_test(sigrenderer->played, sigrenderer->order * 256 + sigrenderer->row))
				{
					if (sigrenderer->callbacks->loop) {
						if ((*sigrenderer->callbacks->loop)(sigrenderer->callbacks->loop_data))
							return 1;
						bit_array_reset(sigrenderer->played);
						if (sigrenderer->speed == 0)
							goto speed0; // I love goto
					}
				}
				*/
#endif
				bit_array_set(sigrenderer->played, sigrenderer->order * 256 + sigrenderer->row);
				{
					int n;
					for (n = 0; n < DUMB_IT_N_CHANNELS; n++)
					{
						IT_CHANNEL * channel = &sigrenderer->channel[n];
						if (channel->played_patjump)
						{
							if (channel->played_patjump_order == sigrenderer->order)
							{
								bit_array_set(channel->played_patjump, sigrenderer->row);
							}
							/*
							else if ((channel->played_patjump_order & 0x7FFF) == sigrenderer->order)
							{
								channel->played_patjump_order |= 0x4000;
							}
							else if ((channel->played_patjump_order & 0x3FFF) == sigrenderer->order)
							{
								if ((sigdata->flags & (IT_WAS_AN_XM|IT_WAS_A_MOD)) == IT_WAS_AN_XM)
								{
									// joy, was XM, pattern loop bug triggered break to row in same order 
									bit_array_mask(sigrenderer->played, channel->played_patjump, sigrenderer->order * 256);
								}
								bit_array_destroy(channel->played_patjump);
								channel->played_patjump = 0;
								channel->played_patjump_order = 0xFFFE;
							}
							*/
							else
							{
								bit_array_destroy(channel->played_patjump);
								channel->played_patjump = 0;
								channel->played_patjump_order = 0xFFFE;
							}
						}
					}
				}
			}
#endif

			sigrenderer->processrow++;

			if (sigrenderer->processrow >= sigrenderer->n_rows) {
				IT_PATTERN *pattern;
				int n;
				int processorder = sigrenderer->processorder;

				if ((sigrenderer->processrow|0xC00) == 0xFFFE + 1) { /* It was incremented above! */
					sigrenderer->processrow = sigrenderer->breakrow;
					sigrenderer->breakrow = 0;
					for (n = 0; n < DUMB_IT_N_CHANNELS; n++) sigrenderer->channel[n].pat_loop_end_row = 0;
				} else {
					sigrenderer->processrow = sigrenderer->breakrow;
					sigrenderer->breakrow = 0; // XXX lolwut
				}

				if (sigrenderer->processorder == 0xFFFF)
					sigrenderer->processorder = sigrenderer->order - 1;

				for (;;) {
					sigrenderer->processorder++;

					if (sigrenderer->processorder >= sigdata->n_orders) {
						sigrenderer->processorder = sigrenderer->restart_position;
						if (sigrenderer->processorder >= sigdata->n_orders) {
							/* Restarting beyond end. We'll loop for now. */
							sigrenderer->processorder = -1;
							continue;
						}
						if (sigdata->flags & IT_WAS_AN_OKT) {
							/* Reset some things */
							sigrenderer->speed = sigdata->speed;
							sigrenderer->tempo = sigdata->tempo;
							for (n = 0; n < DUMB_IT_N_CHANNELS; n++) {
								xm_note_off(sigdata, &sigrenderer->channel[n]);
							}
						}
					}

					n = sigdata->order[sigrenderer->processorder];

					if (n < sigdata->n_patterns)
						break;

#ifdef INVALID_ORDERS_END_SONG
					if (n != IT_ORDER_SKIP)
#else
					if (n == IT_ORDER_END)
#endif
					{
						sigrenderer->processorder = sigrenderer->restart_position - 1;
					}

#ifdef BIT_ARRAY_BULLSHIT
					/* Fix play tracking and timekeeping for orders containing skip commands */
					for (n = 0; n < 256; n++) {
						bit_array_set(sigrenderer->played, sigrenderer->processorder * 256 + n);
					}
#endif
				}

				pattern = &sigdata->pattern[n];

				n = sigrenderer->n_rows;
				sigrenderer->n_rows = pattern->n_rows;

				if (sigrenderer->processrow >= sigrenderer->n_rows)
					sigrenderer->processrow = 0;

/** WARNING - everything pertaining to a new pattern initialised? */

				sigrenderer->entry = sigrenderer->entry_start = pattern->entry;
				sigrenderer->entry_end = sigrenderer->entry + pattern->n_entries;

				/* If n_rows was 0, we're only just starting. Don't do anything weird here. */
				/* added: process row check, for break to row spooniness */
				if (n && (processorder == 0xFFFF ? sigrenderer->order > sigrenderer->processorder : sigrenderer->order >= sigrenderer->processorder)
#ifdef BIT_ARRAY_BULLSHIT
					&& bit_array_test(sigrenderer->played, sigrenderer->processorder * 256 + sigrenderer->processrow)
#endif
					) {
					if (sigrenderer->callbacks->loop) {
						if ((*sigrenderer->callbacks->loop)(sigrenderer->callbacks->loop_data))
							return 1;
#ifdef BIT_ARRAY_BULLSHIT
						bit_array_reset(sigrenderer->played);
#endif
						if (sigrenderer->speed == 0)
							goto speed0; /* I love goto */
					}
				}
				sigrenderer->order = sigrenderer->processorder;

				n = sigrenderer->processrow;
				while (n) {
					while (sigrenderer->entry < sigrenderer->entry_end) {
						if (IT_IS_END_ROW(sigrenderer->entry)) {
							sigrenderer->entry++;
							break;
						}
						sigrenderer->entry++;
					}
					n--;
				}
				sigrenderer->row = sigrenderer->processrow;
			} else {
				if (sigrenderer->entry) {
					while (sigrenderer->entry < sigrenderer->entry_end) {
						if (IT_IS_END_ROW(sigrenderer->entry)) {
							sigrenderer->entry++;
							break;
						}
						sigrenderer->entry++;
					}
					sigrenderer->row++;
				} else {
#ifdef BIT_ARRAY_BULLSHIT
					bit_array_clear(sigrenderer->played, sigrenderer->order * 256);
#endif
					sigrenderer->entry = sigrenderer->entry_start;
					sigrenderer->row = 0;
				}
			}

			if (!(sigdata->flags & IT_WAS_A_669))
				reset_effects(sigrenderer);

			{
				IT_ENTRY *entry = sigrenderer->entry;
				int ignore_cxx = 0;

				while (entry < sigrenderer->entry_end && !IT_IS_END_ROW(entry))
					ignore_cxx |= update_pattern_variables(sigrenderer, entry++);

				entry = sigrenderer->entry;

				while (entry < sigrenderer->entry_end && !IT_IS_END_ROW(entry))
					if (process_entry(sigrenderer, entry++, sigdata->flags & IT_WAS_AN_XM ? 0 : ignore_cxx))
						return 1;
			}

			if (sigdata->flags & IT_WAS_AN_OKT)
				update_effects(sigrenderer);
			else if (!(sigdata->flags & IT_OLD_EFFECTS))
				update_smooth_effects(sigrenderer);
		} else {
			{
				IT_ENTRY *entry = sigrenderer->entry;

				while (entry < sigrenderer->entry_end && !IT_IS_END_ROW(entry)) {
					if (entry->mask & IT_ENTRY_EFFECT && entry->effect != IT_SET_SAMPLE_OFFSET)
						process_effects(sigrenderer, entry, 0);
							/* Don't bother checking the return value; if there
							 * was a pattern delay, there can't be a speed=0.
							 */
					entry++;
				}
			}

			update_effects(sigrenderer);
		}
	} else {
		if ( !(sigdata->flags & IT_WAS_AN_STM) || !(sigrenderer->tick & 15)) {
			speed0:
			update_effects(sigrenderer);
			update_tick_counts(sigrenderer);
		}
	}

	if (sigrenderer->globalvolume == 0) {
		if (sigrenderer->callbacks->global_volume_zero) {
			LONG_LONG t = sigrenderer->gvz_sub_time + ((TICK_TIME_DIVIDEND / (sigrenderer->tempo << 8)) << 16);
			sigrenderer->gvz_time += (int)(t >> 16);
			sigrenderer->gvz_sub_time = (int)t & 65535;
			if (sigrenderer->gvz_time >= 65536 * 12) {
				if ((*sigrenderer->callbacks->global_volume_zero)(sigrenderer->callbacks->global_volume_zero_data))
					return 1;
			}
		}
	} else {
		if (sigrenderer->callbacks->global_volume_zero) {
			sigrenderer->gvz_time = 0;
			sigrenderer->gvz_sub_time = 0;
		}
	}

	process_all_playing(sigrenderer);

	{
		LONG_LONG t = (TICK_TIME_DIVIDEND / (sigrenderer->tempo << 8)) << 16;
		if ( sigrenderer->sigdata->flags & IT_WAS_AN_STM ) {
			t /= 16;
		}
		t += sigrenderer->sub_time_left;
		sigrenderer->time_left += (int)(t >> 16);
		sigrenderer->sub_time_left = (int)t & 65535;
	}

	return 0;
}